

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

ParseNodeClass * __thiscall
Parser::ParseClassDecl<true>
          (Parser *this,BOOL isDeclaration,LPCOLESTR pNameHint,uint32 *pHintLength,
          uint32 *pShortNameOffset)

{
  ushort *puVar1;
  BOOL BVar2;
  tokens tVar3;
  IdentPtr pIVar4;
  long lVar5;
  EncodedCharPtr puVar6;
  EncodedCharPtr puVar7;
  code *pcVar8;
  ushort flags;
  uint32 uVar9;
  tokens tVar10;
  charcount_t cVar11;
  undefined4 uVar12;
  IdentPtr pIVar13;
  ParseNodeFnc *pPVar14;
  BlockInfoStack *pBVar15;
  LPCWSTR pWVar16;
  IdentPtr pIVar17;
  undefined8 extraout_RAX;
  LPCOLESTR pOVar18;
  ParseNodeBin *pPVar19;
  ParseNodeBin *this_00;
  FncFlags FVar20;
  uint32 uVar21;
  ThreadConfiguration *pTVar22;
  byte bVar23;
  FncFlags FVar24;
  Parser *this_01;
  Parser *pPVar25;
  bool bVar26;
  uint uVar27;
  undefined8 uVar28;
  ulong uVar29;
  ParseNodePtr *ppPVar30;
  bool bVar31;
  bool bVar32;
  undefined1 local_238 [8];
  ArenaAllocator tempAllocator;
  RestorePoint beginClass;
  ParseNode **local_178;
  ParseNodePtr *lastMemberNodeRef;
  LPCOLESTR emptyHint_1;
  IdentPtr local_160;
  char16_t *local_158;
  HashTbl *local_150;
  ParseNode *local_148;
  ParseNodePtr pnodeMembers;
  ParseNodePtr *ppnodeScopeSave;
  ParseNodePtr *ppnodeExprScopeSave;
  size_t local_128;
  Token *local_120;
  undefined1 auStack_118 [8];
  RestorePoint beginStatic;
  State state;
  ParseNodePtr local_c0;
  ParseNodeVar *local_b8;
  IdentPtr local_b0;
  IdentPtr pidHint;
  ParseNodeType *local_a0;
  ulong local_98;
  IdentPtr local_90;
  ParseNodeStr *local_88;
  ParseNodePtr pnodeMemberName;
  undefined4 *local_78;
  LPCOLESTR local_70;
  LPCOLESTR pMemberNameHint;
  IdentPtr local_60;
  undefined8 local_58;
  undefined4 local_4c;
  uint32 local_48;
  uint32 local_44;
  Parser *pPStack_40;
  uint32 memberNameOffset;
  uint32 local_38;
  uint local_34;
  uint32 memberNameHintLength;
  
  local_148 = (ParseNodePtr)0x0;
  local_98 = 0;
  local_178 = (ParseNode **)0x0;
  local_48 = 0;
  if (pHintLength != (uint32 *)0x0) {
    local_48 = *pHintLength;
  }
  if (pShortNameOffset != (uint32 *)0x0) {
    local_98 = (ulong)*pShortNameOffset;
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_238,
             L"ClassMemberNames",
             (this->m_nodeAllocator).
             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
             super_ArenaData.pageAllocator,OutOfMemory,JsUtil::ExternalApi::RecoverUnusedMemory);
  local_a0 = CreateNodeForOpT<(OpCode)86>(this);
  pPStack_40 = (Parser *)&this->m_scan;
  emptyHint_1 = (LPCOLESTR)((this->m_scan).m_pchMinTok + -(long)(this->m_scan).m_pchBase);
  BVar2 = this->m_fUseStrictMode;
  this->m_fUseStrictMode = 1;
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan
            ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
  local_120 = (Token *)&this->m_token;
  if ((this->m_token).tk == tkID) {
    pIVar13 = Token::GetIdentifier(local_120,&(this->m_scan).m_htbl);
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
    if ((isDeclaration == 0) || (pIVar13 != (this->wellKnownPropertyPids).arguments)) {
      if (isDeclaration == 0) goto LAB_00e86722;
    }
    else if ((this->m_currentBlockInfo->pnodeBlock->field_0x5c & 3) == 1) {
      pPVar14 = GetCurrentFunctionNode(this);
      puVar1 = &(pPVar14->super_ParseNode).grfpn;
      *(byte *)puVar1 = (byte)*puVar1 | 1;
    }
    local_b8 = CreateBlockScopedDeclNode(this,pIVar13,knopLetDecl);
  }
  else {
    if (isDeclaration != 0) {
      IdentifierExpectedError(this,(Token *)local_120);
      pPVar25 = this;
LAB_00e87404:
      Error(pPVar25,-0x7ff5fc16,L"",L"");
    }
    pIVar13 = (IdentPtr)0x0;
LAB_00e86722:
    local_b8 = (ParseNodeVar *)0x0;
  }
  pPVar25 = pPStack_40;
  pnodeMembers = (ParseNodePtr)0x0;
  ppnodeScopeSave = (ParseNodePtr *)0x0;
  pidHint = (IdentPtr)CreateBlockNode(this,Regular);
  ((ParseNodeBlock *)pidHint)->scope = (Scope *)0x0;
  pBVar15 = PushBlockInfo(this,(ParseNodeBlock *)pidHint);
  pidHint->m_tk = 0;
  pidHint->m_grfid = 0;
  (pBVar15->pstmt).field_0 = (anon_union_8_2_ecfd7102_for_StmtNest_0)pidHint;
  (pBVar15->pstmt).pLabelId = (LabelId *)0x0;
  (pBVar15->pstmt).pstmtOuter = this->m_pstmtCur;
  this->m_pstmtCur = &pBVar15->pstmt;
  this_01 = this;
  PushFuncBlockScope(this,(ParseNodeBlock *)pidHint,(ParseNodePtr **)&pnodeMembers,&ppnodeScopeSave)
  ;
  local_a0->pnodeBlock = (ParseNodeBlock *)pidHint;
  if (pIVar13 == (IdentPtr)0x0) {
    pnodeMemberName = (ParseNodePtr)0x0;
  }
  else {
    this_01 = this;
    pnodeMemberName = &CreateBlockScopedDeclNode(this,pIVar13,knopConstDecl)->super_ParseNode;
  }
  tVar3 = (this->m_token).tk;
  if (tVar3 == tkEXTENDS) {
    Scanner<UTF8EncodingPolicyBase<false>_>::Scan
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
    this_01 = this;
    local_c0 = ParseTerm<true>(this,1,(LPCOLESTR)0x0,(uint32 *)0x0,(uint32 *)0x0,(IdentToken *)0x0,
                               false,1,(BOOL *)0x0,(BOOL *)0x0,(bool *)0x0,(charcount_t *)0x0,
                               (bool *)0x0);
    tVar10 = (this->m_token).tk;
  }
  else {
    local_c0 = (ParseNodePtr)0x0;
    tVar10 = tVar3;
  }
  if (tVar10 != tkLCurly) {
    Error(this_01,-0x7ff5fc10,L"",L"");
  }
  pWVar16 = GetParseType(this);
  local_158 = L"anonymous class";
  if (pIVar13 != (IdentPtr)0x0) {
    local_158 = (char16_t *)&pIVar13->field_0x22;
  }
  Output::TraceWithFlush(ES6VerboseFlag,L"Parsing class (%s) : %s\n",pWVar16,local_158);
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _0_4_ = 0xffffffff;
  tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
  _4_4_ = 0xffffffff;
  Scanner<UTF8EncodingPolicyBase<false>_>::Capture
            ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,
             (RestorePoint *)
             &tempAllocator.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
              .freeList);
  Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
            ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
  if (pnodeMemberName == (ParseNodePtr)0x0) {
    local_90 = (IdentPtr)0x0;
  }
  else {
    local_90 = *(IdentPtr *)&pnodeMemberName[1].ichLim;
  }
  local_150 = &(this->m_scan).m_htbl;
  local_78 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pMemberNameHint = (LPCOLESTR)0x0;
  ppPVar30 = (ParseNodePtr *)0x0;
  do {
    while (tVar10 = (this->m_token).tk, tVar10 == tkSColon) {
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
    }
    if (tVar10 == tkSTATIC) {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,(RestorePoint *)auStack_118);
      tVar10 = Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                         ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
      bVar26 = (this->m_token).tk != tkLParen;
      local_34 = CONCAT31((int3)(tVar10 >> 8),bVar26);
      if (!bVar26) {
        Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,(RestorePoint *)auStack_118);
      }
    }
    else {
      if (tVar10 == tkRCurly) {
        cVar11 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok
                           ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
        (local_a0->super_ParseNode).ichLim = cVar11;
        puVar6 = (this->m_scan).m_currentCharacter;
        puVar7 = (this->m_scan).m_pchBase;
        if (((ulong)ppPVar30 & 1) == 0) {
          pWVar16 = GetParseType(this);
          Output::TraceWithFlush
                    (ES6VerboseFlag,L"Generating constructor (%s) : %s\n",pWVar16,local_158);
          beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
          beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
          beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
          auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
          beginStatic.m_ichMinTok = 0xffffffff;
          beginStatic.m_ichMinLine = 0xffffffff;
          beginStatic._20_16_ = (undefined1  [16])0x0;
          beginStatic.m_fHadEol = -1;
          beginStatic._44_4_ = 0xffffffff;
          Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,(RestorePoint *)auStack_118)
          ;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,
                     (RestorePoint *)
                     &tempAllocator.
                      super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                      freeList);
          pMemberNameHint =
               (LPCOLESTR)GenerateEmptyConstructor<true>(this,local_c0 != (ParseNodePtr)0x0);
          if (local_90 == (IdentPtr)0x0) {
            if (local_48 < (uint)local_98) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *local_78 = 1;
              bVar26 = Js::Throw::ReportAssert
                                 ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                                  ,0x2016,"(nameHintLength >= nameHintOffset)",
                                  "nameHintLength >= nameHintOffset");
              if (!bVar26) {
LAB_00e873a3:
                pcVar8 = (code *)invalidInstructionException();
                (*pcVar8)();
              }
              *local_78 = 0;
            }
            *(LPCOLESTR *)(pMemberNameHint + 0x14) = pNameHint;
            uVar12 = (undefined4)local_98;
            uVar21 = local_48;
          }
          else {
            ((ParseNodeFnc *)pMemberNameHint)->hint = (LPCOLESTR)&local_90->field_0x22;
            uVar12 = 0;
            uVar21 = local_90->m_cch;
          }
          *(uint32 *)(pMemberNameHint + 0x18) = uVar21;
          *(undefined4 *)(pMemberNameHint + 0x1a) = uVar12;
          *(IdentPtr *)(pMemberNameHint + 0x10) = local_90;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25,(RestorePoint *)auStack_118)
          ;
        }
        *(LPCOLESTR *)(pMemberNameHint + 0x48) = emptyHint_1;
        *(long *)(pMemberNameHint + 0x4c) = (long)puVar6 - (long)puVar7;
        PopFuncBlockScope(this,(ParseNodePtr *)pnodeMembers,ppnodeScopeSave);
        local_a0->pnodeDeclName = local_b8;
        local_a0->pnodeName = (ParseNodeVar *)pnodeMemberName;
        local_a0->pnodeConstructor = (ParseNodeFnc *)pMemberNameHint;
        local_a0->pnodeExtends = local_c0;
        local_a0->pnodeMembers = local_148;
        local_a0->isDefaultModuleExport = false;
        FinishParseBlock(this,(ParseNodeBlock *)pidHint,true);
        this->m_fUseStrictMode = BVar2;
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
        ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            local_238);
        return local_a0;
      }
      local_34 = 0;
    }
    Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
              ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPVar25);
    local_128 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
    bVar26 = false;
    local_88 = (ParseNodeStr *)0x0;
    local_b0 = (IdentPtr)0x0;
    local_70 = (LPCOLESTR)0x0;
    local_38 = 0;
    local_44 = 0;
    ppnodeExprScopeSave = ppPVar30;
    if ((this->m_token).tk == tkID) {
      if (((((this->m_scan).field_0x508 & 0x10) == 0) &&
          (pIVar13 = (this->wellKnownPropertyPids).async,
          pIVar17 = Token::GetIdentifier(local_120,local_150), pIVar17 == pIVar13)) &&
         (((this->m_scriptContext->config).threadConfig)->m_ES7AsyncAwait == true)) {
        beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
        beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
        beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
        auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
        beginStatic.m_ichMinTok = 0xffffffff;
        beginStatic.m_ichMinLine = 0xffffffff;
        beginStatic._20_16_ = (undefined1  [16])0x0;
        beginStatic.m_fHadEol = -1;
        beginStatic._44_4_ = 0xffffffff;
        Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40,(RestorePoint *)auStack_118
                  );
        Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
        local_128 = (long)(this->m_scan).m_pchMinTok - (long)(this->m_scan).m_pchBase;
        Scanner<UTF8EncodingPolicyBase<false>_>::Scan
                  ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
        bVar31 = (this->m_token).tk != tkLParen;
        bVar32 = (this->m_scan).m_fHadEol == 0;
        bVar26 = bVar32 && bVar31;
        if (!bVar32 || !bVar31) {
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40,
                     (RestorePoint *)auStack_118);
        }
      }
      else {
        bVar26 = false;
      }
    }
    pTVar22 = (this->m_scriptContext->config).threadConfig;
    tVar10 = (this->m_token).tk;
    bVar23 = tVar10 == tkStar & pTVar22->m_ES6Generators;
    local_60 = (IdentPtr)CONCAT71(local_60._1_7_,bVar23);
    if (bVar23 == 1) {
      Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
      tVar10 = (this->m_token).tk;
      local_4c = (undefined4)CONCAT62((int6)((ulong)pTVar22 >> 0x10),0xe8);
    }
    else {
      local_4c = (undefined4)CONCAT62((int6)((ulong)pTVar22 >> 0x10),0x68);
    }
    pPVar25 = this;
    if ((tVar10 == tkLBrack) &&
       (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
      auStack_118 = (undefined1  [8])0x0;
      ParseComputedName<true>
                (this,(ParseNodePtr *)&local_88,(LPCOLESTR *)auStack_118,&local_70,&local_38,
                 &local_44);
      local_58 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
      bVar31 = false;
      pIVar13 = (IdentPtr)0x0;
LAB_00e86c16:
      pIVar17 = (IdentPtr)0x0;
    }
    else {
      bVar31 = ((this->m_scan).field_0x508 & 0x10) == 0;
      pIVar17 = ParseClassPropertyName(this,&local_b0);
      pIVar13 = local_b0;
      if (local_b0 != (IdentPtr)0x0) {
        local_70 = (LPCOLESTR)&local_b0->field_0x22;
        local_38 = local_b0->m_cch;
      }
      if (pIVar17 == (IdentPtr)0x0) {
        local_58 = 0;
        goto LAB_00e86c16;
      }
      pPVar25 = this;
      local_88 = CreateStrNode(this,pIVar17);
      local_58 = 0;
    }
    if (pIVar17 == (this->wellKnownPropertyPids).constructor && (byte)local_34 == '\0') {
      if (bVar26 != false || ((ulong)ppnodeExprScopeSave & 1) != 0) {
        Error(pPVar25,-0x7ff5fc16,L"",L"");
      }
      uVar29 = (ulong)local_48;
      uVar27 = (uint)local_98;
      pOVar18 = pNameHint;
      if (pnodeMemberName != (ParseNodePtr)0x0) {
        lVar5 = *(long *)&pnodeMemberName[1].ichLim;
        uVar29 = (ulong)local_48;
        if (lVar5 != 0) {
          uVar29 = (ulong)*(uint *)(lVar5 + 0x18);
          pOVar18 = (LPCOLESTR)(lVar5 + 0x22);
          uVar27 = 0;
        }
      }
      pPVar25 = this;
      pMemberNameHint =
           (LPCOLESTR)
           ParseFncDeclNoCheckScope<true>
                     (this,(ushort)local_4c | (ushort)(tVar3 != tkEXTENDS) << 0xb | 0x400,
                      (tVar3 != tkEXTENDS) + CallAndPropertyAllowed,pOVar18,true,false,true);
      if ((((ParseNodeFnc *)pMemberNameHint)->fncFlags & kFunctionIsGenerator) != kFunctionNone) {
        Error(pPVar25,-0x7ff5fbce,L"",L"");
      }
      if ((uint)uVar29 < uVar27) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_78 = 1;
        bVar26 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x1f82,"(constructorNameLength >= constructorShortNameHintOffset)",
                            "constructorNameLength >= constructorShortNameHintOffset");
        if (!bVar26) goto LAB_00e873a3;
        *local_78 = 0;
      }
      *(LPCOLESTR *)(pMemberNameHint + 0x14) = pOVar18;
      *(uint *)(pMemberNameHint + 0x18) = (uint)uVar29;
      *(uint *)(pMemberNameHint + 0x1a) = uVar27;
      if ((pnodeMemberName == (ParseNodePtr)0x0) ||
         (pIVar13 = *(IdentPtr *)&pnodeMemberName[1].ichLim, pIVar13 == (IdentPtr)0x0)) {
        pIVar13 = (this->wellKnownPropertyPids).constructor;
      }
      *(IdentPtr *)(pMemberNameHint + 0x10) = pIVar13;
      *(uint *)(pMemberNameHint + 0x40) = *(uint *)(pMemberNameHint + 0x40) | 0x200080;
      ppPVar30 = (ParseNodePtr *)CONCAT71((int7)(uVar29 >> 8),1);
      pPVar25 = pPStack_40;
    }
    else {
      beginStatic.m_cMinTokMultiUnits._0_4_ = 0xffffffff;
      beginStatic.m_cMinTokMultiUnits._4_4_ = 0xffffffff;
      beginStatic.m_cMinLineMultiUnits._0_4_ = 0xffffffff;
      auStack_118 = (undefined1  [8])&DAT_ffffffffffffffff;
      beginStatic.m_ichMinTok = 0xffffffff;
      beginStatic.m_ichMinLine = 0xffffffff;
      beginStatic._20_16_ = (undefined1  [16])0x0;
      beginStatic.m_fHadEol = -1;
      beginStatic._44_4_ = 0xffffffff;
      pPVar25 = pPStack_40;
      Scanner<UTF8EncodingPolicyBase<false>_>::Capture
                ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40,(RestorePoint *)auStack_118);
      if (bVar31) {
        if ((pIVar17 == (this->wellKnownPropertyPids).get) ||
           (pIVar17 == (this->wellKnownPropertyPids).set)) {
          pPVar25 = pPStack_40;
          Scanner<UTF8EncodingPolicyBase<false>_>::ScanForcingPid
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40);
        }
        tVar10 = (this->m_token).tk;
        if (tVar10 == tkLParen) {
LAB_00e86e4c:
          pPVar25 = pPStack_40;
          Scanner<UTF8EncodingPolicyBase<false>_>::SeekTo
                    ((Scanner<UTF8EncodingPolicyBase<false>_> *)pPStack_40,
                     (RestorePoint *)auStack_118);
          goto LAB_00e86e5c;
        }
        pIVar4 = (this->wellKnownPropertyPids).get;
        if ((pIVar17 != pIVar4) && (pIVar17 != (this->wellKnownPropertyPids).set))
        goto LAB_00e86e5c;
        pPVar25 = this;
        if ((tVar10 == tkLBrack) &&
           (((this->m_scriptContext->config).threadConfig)->m_ES6ObjectLiterals == true)) {
          lastMemberNodeRef = (ParseNodePtr *)0x0;
          ParseComputedName<true>
                    (this,(ParseNodePtr *)&local_88,(LPCOLESTR *)&lastMemberNodeRef,&local_70,
                     &local_38,&local_44);
          uVar28 = CONCAT71((int7)((ulong)pIVar13 >> 8),1);
          local_60 = pIVar17;
        }
        else {
          local_60 = ParseClassPropertyName(this,&local_b0);
          uVar28 = local_58;
        }
        if ((byte)local_34 == '\0') {
          if ((~bVar26 & local_60 != (this->wellKnownPropertyPids).constructor) == 0)
          goto LAB_00e87404;
        }
        else if (bVar26 != false || local_60 == (this->wellKnownPropertyPids).prototype)
        goto LAB_00e87404;
        if (local_60 != (IdentPtr)0x0 && (char)uVar28 == '\0') {
          local_88 = CreateStrNode(this,local_60);
        }
        pIVar13 = local_b0;
        pOVar18 = (LPCOLESTR)&local_b0->field_0x22;
        if (local_b0 == (IdentPtr)0x0) {
          pOVar18 = (LPCOLESTR)0x0;
        }
        local_58 = uVar28;
        pPVar14 = ParseFncDeclNoCheckScope<true>
                            (this,(ushort)local_4c + 2 + (ushort)(pIVar17 != pIVar4) * 2,
                             PropertyAllowed,pOVar18,true,false,true);
        FVar24 = local_34 << 0x18 |
                 pPVar14->fncFlags &
                 (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                  kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                  kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionHasDefaultArguments|
                  kFunctionIsGeneratedDefault|kFunctionHasHomeObj|kFunctionIsClassMember|
                  kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|kFunctionIsMethod|
                  kFunctionHasSuperReference|kFunctionHasNonSimpleParameterList|
                  kFunctionChildCallsEval|kFunctionIsLambda|kFunctionHasWithStmt|
                  kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                  kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                  kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                  kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|kFunctionNested);
        FVar20 = FVar24 | kFunctionHasComputedName;
        if ((char)local_58 == '\0') {
          FVar20 = FVar24;
        }
        pPVar14->fncFlags = FVar20 | (kFunctionHasHomeObj|kFunctionIsAccessor);
        local_34 = local_34 & 0xff;
        this_00 = CreateBinNode(this,pIVar17 == pIVar4 | knopSetMember,&local_88->super_ParseNode,
                                &pPVar14->super_ParseNode);
        local_70 = ConstructFinalHintNode
                             (this,local_90,pIVar13,
                              (&(this->wellKnownPropertyPids).set)[pIVar17 == pIVar4],
                              SUB41(local_34,0),&local_38,&local_44,(bool)(char)local_58,local_70);
        pIVar13 = local_60;
      }
      else {
        if ((this->m_token).tk == tkLParen) goto LAB_00e86e4c;
LAB_00e86e5c:
        local_160 = pIVar17;
        if ((pIVar17 == (this->wellKnownPropertyPids).prototype & (byte)local_34) == 1) {
          Error(pPVar25,-0x7ff5fc16,L"",L"");
        }
        flags = (ushort)local_4c;
        if (bVar26 != false) {
          flags = (ushort)local_4c | 0x100;
        }
        pOVar18 = (LPCOLESTR)&pIVar13->field_0x22;
        if (pIVar13 == (IdentPtr)0x0) {
          pOVar18 = (LPCOLESTR)0x0;
        }
        pPVar14 = ParseFncDeclNoCheckScope<true>(this,flags,PropertyAllowed,pOVar18,true,false,true)
        ;
        bVar31 = SUB81(local_58,0);
        if ((byte)(bVar26 | (byte)local_60 | bVar31) == 1) {
          pPVar14->cbStringMin = local_128;
          pPVar14->cbStringLim = pPVar14->cbLim;
        }
        bVar26 = (bool)(byte)local_34;
        FVar24 = local_34 << 0x18 |
                 pPVar14->fncFlags &
                 (kFunctionHasAnyWriteToFormals|kFunctionIsDefaultModuleExport|
                  kFunctionHasDirectSuper|kFunctionIsAsync|kFunctionIsDeclaredInParamScope|
                  kFunctionAsmjsMode|kFunctionIsGenerator|kFunctionHasDefaultArguments|
                  kFunctionIsGeneratedDefault|kFunctionHasHomeObj|kFunctionIsClassMember|
                  kFunctionIsBaseClassConstructor|kFunctionIsClassConstructor|kFunctionIsMethod|
                  kFunctionHasSuperReference|kFunctionHasNonSimpleParameterList|
                  kFunctionChildCallsEval|kFunctionIsLambda|kFunctionHasWithStmt|
                  kFunctionHasComputedName|kFunctionIsModule|kFunctionHasDestructuredParams|
                  kFunctionStrictMode|kFunctionHasNonThisStmt|kFunctionIsAccessor|
                  kFunctionHasReferenceableBuiltInArguments|kFunctionHasHeapArguments|
                  kFunctionUsesArguments|kFunctionCallsEval|kFunctionDeclaration|kFunctionNested);
        FVar20 = FVar24 | kFunctionHasComputedName;
        if (bVar31 == false) {
          FVar20 = FVar24;
        }
        pPVar14->fncFlags = FVar20 | kFunctionHasHomeObj;
        this_00 = CreateBinNode(this,knopMember,&local_88->super_ParseNode,&pPVar14->super_ParseNode
                               );
        local_70 = ConstructFinalHintNode
                             (this,local_90,pIVar13,(IdentPtr)0x0,bVar26,&local_38,&local_44,bVar31,
                              local_70);
        pIVar13 = local_160;
      }
      if (local_38 < local_44) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_78 = 1;
        bVar26 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                            ,0x1ff0,"(memberNameHintLength >= memberNameOffset)",
                            "memberNameHintLength >= memberNameOffset");
        if (!bVar26) goto LAB_00e873a3;
        *local_78 = 0;
      }
      pOVar18 = local_70;
      pPVar19 = ParseNode::AsParseNodeBin(&this_00->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar19->pnode2);
      uVar9 = local_38;
      pPVar14->hint = pOVar18;
      pPVar19 = ParseNode::AsParseNodeBin(&this_00->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar19->pnode2);
      uVar21 = local_44;
      pPVar14->hintLength = uVar9;
      pPVar19 = ParseNode::AsParseNodeBin(&this_00->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar19->pnode2);
      pPVar14->hintOffset = uVar21;
      pPVar19 = ParseNode::AsParseNodeBin(&this_00->super_ParseNode);
      pPVar14 = ParseNode::AsParseNodeFnc(pPVar19->pnode2);
      pPVar14->pid = pIVar13;
      AddToNodeList(this,&local_148,&local_178,&this_00->super_ParseNode);
      pPVar25 = pPStack_40;
      ppPVar30 = ppnodeExprScopeSave;
    }
  } while( true );
}

Assistant:

ParseNodeClass * Parser::ParseClassDecl(BOOL isDeclaration, LPCOLESTR pNameHint, uint32 *pHintLength, uint32 *pShortNameOffset)
{
    bool hasConstructor = false;
    bool hasExtends = false;
    IdentPtr name = nullptr;
    ParseNodeVar * pnodeName = nullptr;
    ParseNodeFnc * pnodeConstructor = nullptr;
    ParseNodePtr pnodeExtends = nullptr;
    ParseNodePtr pnodeMembers = nullptr;
    ParseNodePtr *lastMemberNodeRef = nullptr;
    uint32 nameHintLength = pHintLength ? *pHintLength : 0;
    uint32 nameHintOffset = pShortNameOffset ? *pShortNameOffset : 0;

    ArenaAllocator tempAllocator(_u("ClassMemberNames"), m_nodeAllocator.GetPageAllocator(), Parser::OutOfMemory);

    size_t cbMinConstructor = 0;
    ParseNodeClass * pnodeClass = nullptr;
    if (buildAST)
    {
        pnodeClass = CreateNodeForOpT<knopClassDecl>();

        CHAKRATEL_LANGSTATS_INC_LANGFEATURECOUNT(ES6, Class, m_scriptContext);

        cbMinConstructor = this->GetScanner()->IecpMinTok();
    }

    BOOL strictSave = m_fUseStrictMode;
    m_fUseStrictMode = TRUE;

    this->GetScanner()->Scan();
    if (m_token.tk == tkID)
    {
        name = m_token.GetIdentifier(this->GetHashTbl());
        this->GetScanner()->Scan();
    }
    else if (isDeclaration)
    {
        IdentifierExpectedError(m_token);
    }

    if (isDeclaration && name == wellKnownPropertyPids.arguments && GetCurrentBlockInfo()->pnodeBlock->blockType == Function)
    {
        GetCurrentFunctionNode()->grfpn |= PNodeFlags::fpnArguments_overriddenByDecl;
    }

    ParseNodeVar * pnodeDeclName = nullptr;
    if (isDeclaration)
    {
        pnodeDeclName = CreateBlockScopedDeclNode(name, knopLetDecl);
    }

    ParseNodePtr *ppnodeScopeSave = nullptr;
    ParseNodePtr *ppnodeExprScopeSave = nullptr;

    ParseNodeBlock * pnodeBlock = StartParseBlock<buildAST>(PnodeBlockType::Regular, ScopeType_Block);
    if (buildAST)
    {
        PushFuncBlockScope(pnodeBlock, &ppnodeScopeSave, &ppnodeExprScopeSave);
        pnodeClass->pnodeBlock = pnodeBlock;
    }

    if (name)
    {
        pnodeName = CreateBlockScopedDeclNode(name, knopConstDecl);
    }

    if (m_token.tk == tkEXTENDS)
    {
        this->GetScanner()->Scan();
        pnodeExtends = ParseTerm<buildAST>();
        hasExtends = true;
    }

    if (m_token.tk != tkLCurly)
    {
        Error(ERRnoLcurly);
    }

    OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Parsing class (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

    RestorePoint beginClass;
    this->GetScanner()->Capture(&beginClass);

    this->GetScanner()->ScanForcingPid();

    IdentPtr pClassNamePid = pnodeName ? pnodeName->pid : nullptr;

    for (;;)
    {
        if (m_token.tk == tkSColon)
        {
            this->GetScanner()->ScanForcingPid();
            continue;
        }
        if (m_token.tk == tkRCurly)
        {
            break;
        }

        bool isStatic = false;
        if (m_token.tk == tkSTATIC)
        {
            // 'static' can be used as an IdentifierName here, even in strict mode code. We need to see the next token before we know
            // if this is being used as a keyword. This is similar to the way we treat 'let' in some cases.
            // See https://tc39.github.io/ecma262/#sec-keywords for more info.

            RestorePoint beginStatic;
            this->GetScanner()->Capture(&beginStatic);

            this->GetScanner()->ScanForcingPid();

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginStatic);
            }
            else
            {
                isStatic = true;
            }
        }

        ushort fncDeclFlags = fFncNoName | fFncMethod | fFncClassMember;
        charcount_t ichMin = this->GetScanner()->IchMinTok();
        size_t iecpMin = this->GetScanner()->IecpMinTok();
        ParseNodePtr pnodeMemberName = nullptr;
        IdentPtr pidHint = nullptr;
        IdentPtr memberPid = nullptr;
        bool maybeAccessor = false;
        LPCOLESTR pMemberNameHint = nullptr;
        uint32 memberNameHintLength = 0;
        uint32 memberNameOffset = 0;
        bool isComputedName = false;
        bool isAsyncMethod = false;

        if (CheckContextualKeyword(wellKnownPropertyPids.async) && m_scriptContext->GetConfig()->IsES7AsyncAndAwaitEnabled())
        {
            RestorePoint parsedAsync;
            this->GetScanner()->Capture(&parsedAsync);
            ichMin = this->GetScanner()->IchMinTok();
            iecpMin = this->GetScanner()->IecpMinTok();

            this->GetScanner()->Scan();
            if (m_token.tk == tkLParen || this->GetScanner()->FHadNewLine())
            {
                this->GetScanner()->SeekTo(parsedAsync);
            }
            else
            {
                isAsyncMethod = true;
            }
        }

        bool isGenerator = m_scriptContext->GetConfig()->IsES6GeneratorsEnabled() &&
            m_token.tk == tkStar;
        if (isGenerator)
        {
            fncDeclFlags |= fFncGenerator;
            this->GetScanner()->ScanForcingPid();
        }


        if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
        {
            // Computed member name: [expr] () { }
            LPCOLESTR emptyHint = nullptr;
            ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
            isComputedName = true;
        }
        else // not computed name
        {
            maybeAccessor = !this->GetScanner()->LastIdentifierHasEscape();
            memberPid = this->ParseClassPropertyName(&pidHint);
            if (pidHint)
            {
                pMemberNameHint = pidHint->Psz();
                memberNameHintLength = pidHint->Cch();
            }
        }

        if (buildAST && memberPid)
        {
            pnodeMemberName = CreateStrNode(memberPid);
        }

        if (!isStatic && memberPid == wellKnownPropertyPids.constructor)
        {
            if (hasConstructor || isAsyncMethod)
            {
                Error(ERRsyntax);
            }
            hasConstructor = true;
            LPCOLESTR pConstructorName = nullptr;
            uint32  constructorNameLength = 0;
            uint32  constructorShortNameHintOffset = 0;
            if (pnodeName && pnodeName->pid)
            {
                pConstructorName = pnodeName->pid->Psz();
                constructorNameLength = pnodeName->pid->Cch();
            }
            else
            {
                pConstructorName = pNameHint;
                constructorNameLength = nameHintLength;
                constructorShortNameHintOffset = nameHintOffset;
            }

            {
                SuperRestrictionState::State state = hasExtends ? SuperRestrictionState::CallAndPropertyAllowed : SuperRestrictionState::PropertyAllowed;

                // Add the class constructor flag and base class constructor flag if pnodeExtends is nullptr
                fncDeclFlags |= fFncClassConstructor | (hasExtends ? kFunctionNone : fFncBaseClassConstructor);
                pnodeConstructor = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, state, pConstructorName, /* needsPIDOnRCurlyScan */ true);
            }

            if (pnodeConstructor->IsGenerator())
            {
                Error(ERRConstructorCannotBeGenerator);
            }

            Assert(constructorNameLength >= constructorShortNameHintOffset);
            // The constructor function will get the same name as class.
            pnodeConstructor->hint = pConstructorName;
            pnodeConstructor->hintLength = constructorNameLength;
            pnodeConstructor->hintOffset = constructorShortNameHintOffset;
            pnodeConstructor->pid = pnodeName && pnodeName->pid ? pnodeName->pid : wellKnownPropertyPids.constructor;
            pnodeConstructor->SetHasNonThisStmt();
            pnodeConstructor->SetHasHomeObj();
        }
        else
        {
            ParseNodePtr pnodeMember = nullptr;
            RestorePoint beginMethodName;
            this->GetScanner()->Capture(&beginMethodName);

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                this->GetScanner()->ScanForcingPid();
            }

            if (m_token.tk == tkLParen)
            {
                this->GetScanner()->SeekTo(beginMethodName);
                maybeAccessor = false;
            }

            if (maybeAccessor && (memberPid == wellKnownPropertyPids.get || memberPid == wellKnownPropertyPids.set))
            {
                bool isGetter = (memberPid == wellKnownPropertyPids.get);

                if (m_token.tk == tkLBrack && m_scriptContext->GetConfig()->IsES6ObjectLiteralsEnabled())
                {
                    // Computed get/set member name: get|set [expr] () { }
                    LPCOLESTR emptyHint = nullptr;
                    ParseComputedName<buildAST>(&pnodeMemberName, &emptyHint, &pMemberNameHint, &memberNameHintLength, &memberNameOffset);
                    isComputedName = true;
                }
                else // not computed name
                {
                    memberPid = this->ParseClassPropertyName(&pidHint);
                }

                if ((isStatic ? (memberPid == wellKnownPropertyPids.prototype) : (memberPid == wellKnownPropertyPids.constructor)) || isAsyncMethod)
                {
                    Error(ERRsyntax);
                }
                if (buildAST && memberPid && !isComputedName)
                {
                    pnodeMemberName = CreateStrNode(memberPid);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags | (isGetter ? fFncNoArg : fFncOneArg),
                        SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);
                }

                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeFnc->SetIsAccessor();
                    pnodeMember = CreateBinNode(isGetter ? knopGetMember : knopSetMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint,
                        isGetter ? wellKnownPropertyPids.get : wellKnownPropertyPids.set, isStatic,
                        &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }
            else
            {
                if (isStatic && (memberPid == wellKnownPropertyPids.prototype))
                {
                    Error(ERRsyntax);
                }

                ParseNodeFnc * pnodeFnc = nullptr;
                {
                    if (isAsyncMethod)
                    {
                        fncDeclFlags |= fFncAsync;
                    }
                    pnodeFnc = ParseFncDeclNoCheckScope<buildAST>(fncDeclFlags, SuperRestrictionState::PropertyAllowed, pidHint ? pidHint->Psz() : nullptr, /* needsPIDOnRCurlyScan */ true);

                    if (isAsyncMethod || isGenerator || isComputedName)
                    {
                        pnodeFnc->cbStringMin = iecpMin;
                        pnodeFnc->cbStringLim = pnodeFnc->cbLim;
                    }
                }
                pnodeFnc->SetIsStaticMember(isStatic);
                if (isComputedName)
                {
                    pnodeFnc->SetHasComputedName();
                }
                pnodeFnc->SetHasHomeObj();

                if (buildAST)
                {
                    pnodeMember = CreateBinNode(knopMember, pnodeMemberName, pnodeFnc);
                    pMemberNameHint = ConstructFinalHintNode(pClassNamePid, pidHint, nullptr /*pgetset*/, isStatic, &memberNameHintLength, &memberNameOffset, isComputedName, pMemberNameHint);
                }
            }

            if (buildAST)
            {
                Assert(memberNameHintLength >= memberNameOffset);
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hint = pMemberNameHint; // Fully qualified name
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintLength = memberNameHintLength;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->hintOffset = memberNameOffset;
                pnodeMember->AsParseNodeBin()->pnode2->AsParseNodeFnc()->pid = memberPid; // Short name

                AddToNodeList(&pnodeMembers, &lastMemberNodeRef, pnodeMember);
            }
        }
    }

    size_t cbLimConstructor = 0;
    if (buildAST)
    {
        pnodeClass->ichLim = this->GetScanner()->IchLimTok();
        cbLimConstructor = this->GetScanner()->IecpLimTok();
    }

    if (!hasConstructor)
    {
        OUTPUT_TRACE_DEBUGONLY(Js::ES6VerboseFlag, _u("Generating constructor (%s) : %s\n"), GetParseType(), name ? name->Psz() : _u("anonymous class"));

        RestorePoint endClass;
        this->GetScanner()->Capture(&endClass);
        this->GetScanner()->SeekTo(beginClass);

        pnodeConstructor = GenerateEmptyConstructor<buildAST>(pnodeExtends != nullptr);

        if (buildAST)
        {
            if (pClassNamePid)
            {
                pnodeConstructor->hint = pClassNamePid->Psz();
                pnodeConstructor->hintLength = pClassNamePid->Cch();
                pnodeConstructor->hintOffset = 0;
            }
            else
            {
                Assert(nameHintLength >= nameHintOffset);
                pnodeConstructor->hint = pNameHint;
                pnodeConstructor->hintLength = nameHintLength;
                pnodeConstructor->hintOffset = nameHintOffset;
            }
            pnodeConstructor->pid = pClassNamePid;
        }

        this->GetScanner()->SeekTo(endClass);
    }

    if (buildAST)
    {
        pnodeConstructor->cbStringMin = cbMinConstructor;
        pnodeConstructor->cbStringLim = cbLimConstructor;

        PopFuncBlockScope(ppnodeScopeSave, ppnodeExprScopeSave);

        pnodeClass->pnodeDeclName = pnodeDeclName;
        pnodeClass->pnodeName = pnodeName;
        pnodeClass->pnodeConstructor = pnodeConstructor;
        pnodeClass->pnodeExtends = pnodeExtends;
        pnodeClass->pnodeMembers = pnodeMembers;
        pnodeClass->isDefaultModuleExport = false;
    }
    FinishParseBlock(pnodeBlock);

    m_fUseStrictMode = strictSave;

    this->GetScanner()->Scan();

    return pnodeClass;
}